

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

bool Js::JavascriptOperators::IteratorStep
               (RecyclableObject *iterator,ScriptContext *scriptContext,RecyclableObject *nextFunc,
               RecyclableObject **result)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Var in_RAX;
  undefined4 *puVar4;
  RecyclableObject *object;
  Var local_38;
  Var value;
  
  local_38 = in_RAX;
  if (result == (RecyclableObject **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2be1,"(result)","result");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  object = IteratorNext(iterator,scriptContext,nextFunc,(Var)0x0);
  *result = object;
  GetProperty_InternalSimple(object,object,0x74,&local_38,scriptContext);
  BVar3 = JavascriptConversion::ToBoolean(local_38,scriptContext);
  return BVar3 == 0;
}

Assistant:

bool JavascriptOperators::IteratorStep(RecyclableObject* iterator, ScriptContext* scriptContext, RecyclableObject* nextFunc, RecyclableObject** result)
    {
        Assert(result);

        *result = JavascriptOperators::IteratorNext(iterator, scriptContext, nextFunc);
        return !JavascriptOperators::IteratorComplete(*result, scriptContext);
    }